

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O2

void __thiscall QWidgetRepaintManager::removeDirtyWidget(QWidgetRepaintManager *this,QWidget *w)

{
  uint uVar1;
  long lVar2;
  QWidget *w_00;
  QWidgetRepaintManager *this_00;
  ulong uVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  QWidget *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = w;
  if (w != (QWidget *)0x0) {
    QtPrivate::sequential_erase_with_copy<QList<QWidget*>,QWidget*>
              ((QList<QWidget_*> *)(this + 0x18),&local_30);
    this_00 = this + 0x30;
    QtPrivate::sequential_erase_with_copy<QList<QWidget*>,QWidget*>
              ((QList<QWidget_*> *)this_00,&local_30);
    resetWidget(this_00,local_30);
    QtPrivate::sequential_erase_with_copy<QList<QWidget*>,QWidget*>
              ((QList<QWidget_*> *)(this + 0x50),&local_30);
    lVar2 = *(long *)&local_30->field_0x8;
    uVar1 = *(uint *)(lVar2 + 0x28);
    uVar3 = 0;
    uVar4 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar4 = uVar3;
    }
    for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      w_00 = *(QWidget **)(*(long *)(lVar2 + 0x20) + uVar3 * 8);
      if ((w_00 != (QWidget *)0x0) && ((*(byte *)(*(long *)&w_00->field_0x8 + 0x30) & 1) != 0)) {
        removeDirtyWidget(this,w_00);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetRepaintManager::removeDirtyWidget(QWidget *w)
{
    if (!w)
        return;

    dirtyWidgets.removeAll(w);
    dirtyRenderToTextureWidgets.removeAll(w);
    resetWidget(w);

    needsFlushWidgets.removeAll(w);

    QWidgetPrivate *wd = w->d_func();
    const int n = wd->children.size();
    for (int i = 0; i < n; ++i) {
        if (QWidget *child = qobject_cast<QWidget*>(wd->children.at(i)))
            removeDirtyWidget(child);
    }
}